

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> * __thiscall
cmTarget::GetUtilityItems(cmTarget *this)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmTargetInternals *pcVar3;
  cmTarget *pcVar4;
  _Base_ptr p_Var5;
  cmLinkItem local_58;
  
  pcVar3 = (this->Internal).Pointer;
  if (pcVar3->UtilityItemsDone == false) {
    pcVar3->UtilityItemsDone = true;
    p_Var5 = (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->Utilities)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      do {
        pcVar3 = (this->Internal).Pointer;
        pcVar4 = cmMakefile::FindTargetToUse(this->Makefile,(string *)(p_Var5 + 1),false);
        paVar2 = &local_58.super_string.field_2;
        local_58.super_string._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,*(long *)(p_Var5 + 1),
                   (long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
        local_58.Target = pcVar4;
        std::
        _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
        ::_M_insert_unique<cmLinkItem>(&(pcVar3->UtilityItems)._M_t,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58.super_string._M_dataplus._M_p != paVar2) {
          operator_delete(local_58.super_string._M_dataplus._M_p,
                          local_58.super_string.field_2._M_allocated_capacity + 1);
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var1);
    }
  }
  return &((this->Internal).Pointer)->UtilityItems;
}

Assistant:

std::set<cmLinkItem> const& cmTarget::GetUtilityItems() const
{
  if(!this->Internal->UtilityItemsDone)
    {
    this->Internal->UtilityItemsDone = true;
    for(std::set<std::string>::const_iterator i = this->Utilities.begin();
        i != this->Utilities.end(); ++i)
      {
      this->Internal->UtilityItems.insert(
        cmLinkItem(*i, this->Makefile->FindTargetToUse(*i)));
      }
    }
  return this->Internal->UtilityItems;
}